

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::GeometryOutputCountTest::createInstance
          (GeometryOutputCountTest *this,Context *context)

{
  pointer piVar1;
  pointer piVar2;
  pointer pVVar3;
  GeometryExpanderRenderTestInstance *this_00;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  float fVar9;
  undefined4 uVar10;
  
  this_00 = (GeometryExpanderRenderTestInstance *)operator_new(0x78);
  piVar1 = (this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_00,context,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__GeometryExpanderRenderTestInstance_00d4f2a8;
  iVar8 = (int)((ulong)((long)piVar1 - (long)piVar2) >> 2);
  *(int *)&this_00[1].super_TestInstance._vptr_TestInstance = iVar8;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexPosData,(long)iVar8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexAttrData,
             (long)*(int *)&this_00[1].super_TestInstance._vptr_TestInstance);
  uVar6 = *(uint *)&this_00[1].super_TestInstance._vptr_TestInstance;
  uVar7 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      fVar9 = (float)(int)uVar5 / (float)(int)uVar7;
      pVVar3 = (this_00->m_vertexPosData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pVVar3->m_data + lVar4 + -8) = 0xbf800000;
      *(float *)((long)pVVar3->m_data + lVar4 + -4) = fVar9 + fVar9 + -1.0;
      *(undefined8 *)((long)pVVar3->m_data + lVar4) = 0x3f80000000000000;
      uVar10 = 0x3f800000;
      if ((uVar5 & 1) != 0) {
        uVar10 = 0;
      }
      pVVar3 = (this_00->m_vertexAttrData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pVVar3->m_data + lVar4 + -8) = 0x3f800000;
      *(undefined4 *)((long)pVVar3->m_data + lVar4 + -4) = uVar10;
      *(undefined4 *)((long)pVVar3->m_data + lVar4) = uVar10;
      *(undefined4 *)((long)pVVar3->m_data + lVar4 + 4) = 0x3f800000;
      uVar5 = uVar5 + 1;
      uVar6 = *(uint *)&this_00[1].super_TestInstance._vptr_TestInstance;
      uVar7 = (ulong)(int)uVar6;
      lVar4 = lVar4 + 0x10;
    } while ((long)uVar5 < (long)uVar7);
  }
  this_00->m_numDrawVertices = uVar6;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* GeometryOutputCountTest::createInstance (Context& context) const
{
	return new GeometryOutputCountTestInstance (context, VK_PRIMITIVE_TOPOLOGY_POINT_LIST, static_cast<int>(m_pattern.size()), getName());
}